

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

word Abc_Tt6IsopCover(word uOn,word uOnDc,int nVars,int *pCover,int *pnCubes)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  word wVar4;
  word wVar5;
  word wVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  ulong uOnDc_00;
  ulong uVar10;
  ulong uOnDc_01;
  ulong uVar11;
  uint iVar;
  ulong uVar12;
  long lVar13;
  
  if (6 < nVars) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x986,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
  }
  if ((~uOnDc & uOn) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x987,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
  }
  if (uOn == 0) {
    wVar6 = 0;
  }
  else if (uOnDc == 0xffffffffffffffff) {
    iVar8 = *pnCubes;
    *pnCubes = iVar8 + 1;
    pCover[iVar8] = 0;
    wVar6 = 0xffffffffffffffff;
  }
  else {
    uVar12 = (ulong)(uint)nVars;
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x98f,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
    iVar8 = nVars * 2;
    do {
      iVar8 = iVar8 + -2;
      if ((int)uVar12 < 1) {
        __assert_fail("Var >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x994,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
      }
      iVar = (int)uVar12 - 1;
      uVar12 = (ulong)iVar;
      iVar3 = Abc_Tt6HasVar(uOn,iVar);
      if (iVar3 != 0) break;
      iVar3 = Abc_Tt6HasVar(uOnDc,iVar);
    } while (iVar3 == 0);
    uVar2 = s_Truths6Neg[uVar12];
    bVar7 = (byte)(1 << ((byte)iVar & 0x1f));
    uVar10 = (uVar2 & uOn) << (bVar7 & 0x3f) | uVar2 & uOn;
    uVar12 = s_Truths6[uVar12];
    uVar11 = (uVar12 & uOn) >> (bVar7 & 0x3f) | uVar12 & uOn;
    uOnDc_00 = (uVar2 & uOnDc) << (bVar7 & 0x3f) | uVar2 & uOnDc;
    uOnDc_01 = (uOnDc & uVar12) >> (bVar7 & 0x3f) | uOnDc & uVar12;
    iVar3 = *pnCubes;
    wVar4 = Abc_Tt6IsopCover(~uOnDc_01 & uVar10,uOnDc_00,iVar,pCover,pnCubes);
    lVar9 = (long)*pnCubes;
    wVar5 = Abc_Tt6IsopCover(~uOnDc_00 & uVar11,uOnDc_01,iVar,pCover,pnCubes);
    iVar1 = *pnCubes;
    wVar6 = Abc_Tt6IsopCover(~wVar5 & uVar11 | ~wVar4 & uVar10,uOnDc_01 & uOnDc_00,iVar,pCover,
                             pnCubes);
    for (lVar13 = (long)iVar3; lVar13 < lVar9; lVar13 = lVar13 + 1) {
      pCover[lVar13] = pCover[lVar13] | 1 << ((byte)iVar8 & 0x1f);
    }
    for (; lVar9 < iVar1; lVar9 = lVar9 + 1) {
      pCover[lVar9] = pCover[lVar9] | 2 << ((byte)iVar8 & 0x1f);
    }
    wVar6 = wVar5 & uVar12 | wVar4 & uVar2 | wVar6;
    if ((uOn & ~wVar6) != 0) {
      __assert_fail("(uOn & ~uRes2) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x9a7,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
    if ((wVar6 & ~uOnDc) != 0) {
      __assert_fail("(uRes2 & ~uOnDc) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x9a8,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
  }
  return wVar6;
}

Assistant:

static inline word Abc_Tt6IsopCover( word uOn, word uOnDc, int nVars, int * pCover, int * pnCubes )
{
    word uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int c, Var, nBeg0, nEnd0, nEnd1;
    assert( nVars <= 6 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
        return 0;
    if ( uOnDc == ~(word)0 )
    {
        pCover[(*pnCubes)++] = 0;
        return ~(word)0;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( uOn, Var ) || Abc_Tt6HasVar( uOnDc, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = Abc_Tt6Cofactor0( uOn,   Var );
    uOn1   = Abc_Tt6Cofactor1( uOn  , Var );
    uOnDc0 = Abc_Tt6Cofactor0( uOnDc, Var );
    uOnDc1 = Abc_Tt6Cofactor1( uOnDc, Var );
    // solve for cofactors
    nBeg0 = *pnCubes; 
    uRes0 = Abc_Tt6IsopCover( uOn0 & ~uOnDc1, uOnDc0, Var, pCover, pnCubes );
    nEnd0 = *pnCubes;
    uRes1 = Abc_Tt6IsopCover( uOn1 & ~uOnDc0, uOnDc1, Var, pCover, pnCubes );
    nEnd1 = *pnCubes;
    uRes2 = Abc_Tt6IsopCover( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pCover, pnCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & s_Truths6Neg[Var]) | (uRes1 & s_Truths6[Var]);
    for ( c = nBeg0; c < nEnd0; c++ )
        pCover[c] |= (1 << (2*Var+0));
    for ( c = nEnd0; c < nEnd1; c++ )
        pCover[c] |= (1 << (2*Var+1));
    assert( (uOn & ~uRes2) == 0 );
    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}